

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O2

QueueElement * __thiscall
MeCab::FreeList<MeCab::NBestGenerator::QueueElement>::alloc
          (FreeList<MeCab::NBestGenerator::QueueElement> *this)

{
  ulong uVar1;
  QueueElement *pQVar2;
  ulong uVar3;
  size_t sVar4;
  pointer ppQVar5;
  QueueElement *local_18;
  
  uVar3 = this->pi_;
  sVar4 = this->li_;
  uVar1 = this->size;
  if (uVar3 == uVar1) {
    sVar4 = sVar4 + 1;
    this->li_ = sVar4;
    this->pi_ = 0;
    uVar3 = 0;
  }
  ppQVar5 = (this->freeList).
            super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (sVar4 == (long)(this->freeList).
                     super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppQVar5 >> 3) {
    local_18 = (QueueElement *)operator_new__(-(ulong)(uVar1 >> 0x3b != 0) | uVar1 << 5);
    std::
    vector<MeCab::NBestGenerator::QueueElement*,std::allocator<MeCab::NBestGenerator::QueueElement*>>
    ::emplace_back<MeCab::NBestGenerator::QueueElement*>
              ((vector<MeCab::NBestGenerator::QueueElement*,std::allocator<MeCab::NBestGenerator::QueueElement*>>
                *)&this->freeList,&local_18);
    sVar4 = this->li_;
    ppQVar5 = (this->freeList).
              super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = this->pi_;
  }
  pQVar2 = ppQVar5[sVar4];
  this->pi_ = uVar3 + 1;
  return pQVar2 + uVar3;
}

Assistant:

T* alloc() {
    if (pi_ == size) {
      li_++;
      pi_ = 0;
    }
    if (li_ == freeList.size()) freeList.push_back(new T[size]);
    return freeList[li_] + (pi_++);
  }